

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O0

size_t __thiscall
benchmark::internal::BenchmarkFamilies::AddBenchmark
          (BenchmarkFamilies *this,
          unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>
          *family)

{
  size_type sVar1;
  vector<std::unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>,_std::allocator<std::unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>_>_>
  *in_RDI;
  size_t index;
  MutexLock l;
  Mutex *in_stack_ffffffffffffffa8;
  vector<std::unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>,_std::allocator<std::unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>_>_>
  *in_stack_ffffffffffffffb0;
  
  MutexLock::MutexLock((MutexLock *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  sVar1 = std::
          vector<std::unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>,_std::allocator<std::unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>_>_>
          ::size(in_RDI);
  std::
  vector<std::unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>,_std::allocator<std::unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>_>_>
  ::push_back(in_stack_ffffffffffffffb0,(value_type *)in_stack_ffffffffffffffa8);
  MutexLock::~MutexLock((MutexLock *)0x164bef);
  return sVar1;
}

Assistant:

size_t BenchmarkFamilies::AddBenchmark(std::unique_ptr<Benchmark> family) {
  MutexLock l(mutex_);
  size_t index = families_.size();
  families_.push_back(std::move(family));
  return index;
}